

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall cmCPackIFWPackage::DefaultConfiguration(cmCPackIFWPackage *this)

{
  cmCPackIFWPackage *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->DisplayName);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->Description);
  std::__cxx11::string::operator=((string *)&this->Version,"");
  std::__cxx11::string::operator=((string *)&this->ReleaseDate,"");
  std::__cxx11::string::operator=((string *)&this->Script,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Licenses);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->UserInterfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Translations);
  std::__cxx11::string::operator=((string *)&this->SortingPriority,"");
  std::__cxx11::string::operator=((string *)&this->UpdateText,"");
  std::__cxx11::string::operator=((string *)&this->Default,"");
  std::__cxx11::string::operator=((string *)&this->Essential,"");
  std::__cxx11::string::operator=((string *)&this->Virtual,"");
  std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"");
  std::__cxx11::string::operator=((string *)&this->RequiresAdminRights,"");
  return;
}

Assistant:

void cmCPackIFWPackage::DefaultConfiguration()
{
  this->DisplayName.clear();
  this->Description.clear();
  this->Version = "";
  this->ReleaseDate = "";
  this->Script = "";
  this->Licenses.clear();
  this->UserInterfaces.clear();
  this->Translations.clear();
  this->SortingPriority = "";
  this->UpdateText = "";
  this->Default = "";
  this->Essential = "";
  this->Virtual = "";
  this->ForcedInstallation = "";
  this->RequiresAdminRights = "";
}